

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O2

void __thiscall QByteArrayMatcher::QByteArrayMatcher(QByteArrayMatcher *this,QByteArray *pattern)

{
  qsizetype len;
  char *cc;
  
  this->d = (QByteArrayMatcherPrivate *)0x0;
  QArrayDataPointer<char>::QArrayDataPointer(&(this->q_pattern).d,&pattern->d);
  cc = (pattern->d).ptr;
  if ((uchar *)cc == (uchar *)0x0) {
    cc = &QByteArray::_empty;
  }
  (this->field_2).p.p = (uchar *)cc;
  len = (pattern->d).size;
  (this->field_2).p.l = len;
  bm_init_skiptable((uchar *)cc,len,(uchar *)(this->field_2).dummy);
  return;
}

Assistant:

QByteArrayMatcher::QByteArrayMatcher(const QByteArray &pattern)
    : d(nullptr), q_pattern(pattern)
{
    p.p = reinterpret_cast<const uchar *>(pattern.constData());
    p.l = pattern.size();
    bm_init_skiptable(p.p, p.l, p.q_skiptable);
}